

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

int __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  int iVar1;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  iVar1 = ReadInt<int>(this);
  if (-1 < iVar1) {
    return iVar1;
  }
  local_28 = 0;
  uStack_20 = 0;
  local_18.types_ = 0;
  local_18.field_1.values_ = (Value *)&local_28;
  BinaryReaderBase::ReportError(&this->super_BinaryReaderBase,(CStringRef)0x26c03c,&local_18);
}

Assistant:

int ReadUInt() {
    int value = ReadInt<int>();
    if (value < 0)
      ReportError("expected unsigned integer");
    return value;
  }